

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O3

int __thiscall
Potassco::BufferedStream::copy(BufferedStream *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  BufferType pcVar5;
  ulong __n;
  ulong uVar6;
  
  iVar3 = (int)src;
  if (-1 < iVar3) {
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      uVar6 = (ulong)src & 0xffffffff;
      lVar4 = 0;
      do {
        pcVar5 = this->buf_;
        sVar1 = this->rpos_;
        if (pcVar5[sVar1] == '\0') {
          return (int)lVar4;
        }
        __n = -(sVar1 - 0x1000);
        if (uVar6 <= -(sVar1 - 0x1000)) {
          __n = uVar6;
        }
        sVar2 = 0x1000;
        if (sVar1 != 0x1000) {
          memmove(dst,pcVar5 + sVar1,__n);
          pcVar5 = this->buf_;
          sVar2 = this->rpos_;
        }
        this->rpos_ = sVar2 + __n;
        if (pcVar5[sVar2 + __n] == '\0') {
          underflow(this,true);
        }
        dst = dst + __n;
        uVar6 = uVar6 - __n;
        lVar4 = lVar4 + __n;
        iVar3 = (int)lVar4;
      } while (uVar6 != 0);
    }
  }
  return iVar3;
}

Assistant:

int BufferedStream::copy(char* out, int max) {
	if (max < 0) return max;
	std::size_t os = 0;
	for (std::size_t n = static_cast<std::size_t>(max); n && peek();) {
		std::size_t b = (ALLOC_SIZE - rpos_) - 1;
		std::size_t m = std::min(n, b);
		out = std::copy(buf_ + rpos_, buf_ + rpos_ + m, out);
		n -= m;
		os += m;
		rpos_ += m;
		if (!peek()) { underflow(); }
	}
	return static_cast<int>(os);
}